

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abin.c
# Opt level: O1

atomBins * initBins(char serialNum,region *boundingBox,float delta)

{
  double dVar1;
  double dVar2;
  atomBins *b;
  atomPtr ***__ptr;
  atomPtr **__ptr_00;
  atomPtr *__ptr_01;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  double dVar9;
  
  if (delta < 0.1) {
    delta = 5.0;
  }
  dVar1 = (boundingBox->max).y;
  dVar9 = (double)delta;
  dVar2 = floor(((boundingBox->max).x - (boundingBox->min).x) / dVar9 + 1.0);
  uVar7 = (uint)(dVar2 + 2.0);
  dVar1 = floor((dVar1 - (boundingBox->min).y) / dVar9 + 1.0);
  uVar8 = (uint)(dVar1 + 2.0);
  dVar1 = floor(((boundingBox->max).z - (boundingBox->min).z) / dVar9 + 1.0);
  uVar3 = (uint)(dVar1 + 2.0);
  b = (atomBins *)malloc(0x68);
  b->delta = delta;
  dVar1 = (boundingBox->min).y;
  (b->min).x = (boundingBox->min).x;
  (b->min).y = dVar1;
  (b->min).z = (boundingBox->min).z;
  dVar1 = (boundingBox->max).y;
  (b->max).x = (boundingBox->max).x;
  (b->max).y = dVar1;
  (b->max).z = (boundingBox->max).z;
  v3sub(&b->max,(vector3d *)b,&b->sz);
  b->nx = uVar7;
  b->ny = uVar8;
  b->nz = uVar3;
  b->binSerialNum = serialNum;
  __ptr = (atomPtr ***)malloc((long)(int)uVar7 << 3);
  __ptr_00 = (atomPtr **)malloc((long)(int)(uVar8 * uVar7) << 3);
  __ptr_01 = (atomPtr *)malloc((long)(int)(uVar8 * uVar7 * uVar3) << 3);
  if ((((b == (atomBins *)0x0) || (__ptr == (atomPtr ***)0x0)) || (__ptr_00 == (atomPtr **)0x0)) ||
     (__ptr_01 == (atomPtr *)0x0)) {
    warn("could not create atom bins");
    if (b != (atomBins *)0x0) {
      free(b);
    }
    if (__ptr != (atomPtr ***)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (atomPtr **)0x0) {
      free(__ptr_00);
    }
    if (__ptr_01 != (atomPtr *)0x0) {
      free(__ptr_01);
    }
    b = (atomBins *)0x0;
  }
  else {
    b->list = __ptr;
    if (0 < (int)uVar7) {
      uVar4 = 0;
      do {
        b->list[uVar4] = __ptr_00;
        if (0 < (int)uVar8) {
          uVar5 = 0;
          do {
            b->list[uVar4][uVar5] = __ptr_01;
            if (0 < (int)uVar3) {
              uVar6 = 0;
              do {
                b->list[uVar4][uVar5][uVar6] = (atomPtr)0x0;
                uVar6 = uVar6 + 1;
              } while (uVar3 != uVar6);
            }
            __ptr_01 = __ptr_01 + (int)uVar3;
            uVar5 = uVar5 + 1;
          } while (uVar5 != uVar8);
        }
        __ptr_00 = __ptr_00 + (int)uVar8;
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar7);
    }
  }
  return b;
}

Assistant:

atomBins* initBins(char serialNum, region *boundingBox, float delta) {
	atomBins *bp;
	int i, j, k, nx, ny, nz;
	int n1, n2, n3;
	atomPtr ***b1, **b2, *b3;

	if (delta < 0.1) delta = 5.0;

	nx = OFFSET(boundingBox->max.x, boundingBox->min.x, delta) + 2;
	ny = OFFSET(boundingBox->max.y, boundingBox->min.y, delta) + 2;
	nz = OFFSET(boundingBox->max.z, boundingBox->min.z, delta) + 2;

	bp = (atomBins *)malloc(sizeof(atomBins));

	bp->delta = delta;

	bp->min = boundingBox->min;
	bp->max = boundingBox->max;
	v3sub(&(bp->max), &(bp->min), &(bp->sz));
	bp->nx = nx;
	bp->ny = ny;
	bp->nz = nz;
	bp->binSerialNum = serialNum;

	n1 = nx;
	n2 = nx*ny;
	n3 = nx*ny*nz;

	b1 = (atomPtr ***)malloc(sizeof(atomPtr **)*n1);
	b2 = (atomPtr  **)malloc(sizeof(atomPtr  *)*n2);
	b3 = (atomPtr   *)malloc(sizeof(atomPtr   )*n3);
	if (!bp || !b1 || !b2 || !b3) {
		warn("could not create atom bins");
		if (bp) free(bp);
		if (b1) free(b1);
		if (b2) free(b2);
		if (b3) free(b3);
		return NULL;
	}

	bp->list = b1;

	for(i = 0; i < nx; i++) {
		bp->list[i] = b2; b2 += ny;

		for(j = 0; j < ny; j++) {
			bp->list[i][j] = b3; b3 += nz;

			for(k = 0; k < nz; k++) {
				bp->list[i][j][k] = 0;
			}
		}
	}

	return bp;
}